

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O0

string * getCommonCodeGen<std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *vals,vector<int,_std::allocator<int>_> *mapping,size_t n,string *map_name,
                   bool nonKeyLookups)

{
  bool bVar1;
  const_reference pvVar2;
  long lVar3;
  reference pvVar4;
  char *__rhs;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  int *local_468;
  int *val_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  int *local_3a8;
  int *val_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  byte local_2d9;
  reference pbStack_2d8;
  uint8_t i_1;
  string *val_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  value_type_conflict3 local_258;
  reference local_250;
  string *val;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  size_t num_chars;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  byte local_81;
  char *local_80;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [8];
  string upper_name;
  bool nonKeyLookups_local;
  string *map_name_local;
  size_t n_local;
  vector<int,_std::allocator<int>_> *mapping_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vals_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  string *str;
  
  upper_name.field_2._M_local_buf[0xf] = nonKeyLookups;
  std::__cxx11::string::string((string *)local_60,(string *)map_name);
  local_68._M_current = (char *)std::__cxx11::string::begin();
  local_70._M_current = (char *)std::__cxx11::string::end();
  local_78 = (char *)std::__cxx11::string::begin();
  local_80 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                               (local_68,local_70,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_78,toupper);
  local_81 = 0;
  std::operator+(&local_e8,"//CODEGEN FILE\n#ifndef POIFECT_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_c8,&local_e8,"_H\n#define POIFECT_");
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(__return_storage_ptr__,&local_a8,"_H\n#include <array>\n");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  if ((upper_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#include <cassert>\n");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"#include <limits>\n#include <string>\n\n");
  std::operator+(&local_1b8,"class ",map_name);
  std::operator+(&local_198,&local_1b8," final{\npublic:\n    static ");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](keys,0);
  typeStr(&local_1d8,pvVar2);
  bVar1 = std::operator!=(&local_1d8,"std::string");
  __rhs = "";
  if (bVar1) {
    __rhs = "constexpr ";
  }
  std::operator+(&local_178,&local_198,__rhs);
  std::operator+(&local_158,&local_178,"std::string_view lookup(const ");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](keys,0);
  typeStr((string *)&num_chars,pvVar2);
  std::operator+(&local_138,&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_chars);
  std::operator+(&local_118,&local_138,"& key) noexcept;\n\nprivate:\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&num_chars);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((upper_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    #ifndef NDEBUG\n");
  }
  writeKeys(__return_storage_ptr__,keys,mapping,n);
  if ((upper_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    #endif\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(vals);
  val = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(vals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&val);
    if (!bVar1) break;
    local_250 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
               (value_type_conflict3 *)
               &sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    lVar3 = std::__cxx11::string::size();
    sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    local_258 = std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_258);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::to_string
            ((string *)&__range1_1,
             (long)sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1);
  std::operator+(&local_298,"    static constexpr char flat_vals[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
  std::operator+(&local_278,&local_298,"] = ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(vals);
  val_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(vals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&val_1);
    if (!bVar1) break;
    pbStack_2d8 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1_1);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    for (local_2d9 = 0; local_2d9 < 8; local_2d9 = local_2d9 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::operator+(&local_320,'\"',pbStack_2d8);
    std::operator+(&local_300,&local_320,'\"');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n\n");
  std::__cxx11::to_string((string *)&i,n + 1);
  std::operator+(&local_360,"    static constexpr std::array<size_t, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::operator+(&local_340,&local_360,"> val_start {\n        ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&i);
  __range1_2 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1_2 = std::vector<int,_std::allocator<int>_>::begin(mapping);
  val_2 = (int *)std::vector<int,_std::allocator<int>_>::end(mapping);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &val_2);
    if (!bVar1) break;
    local_3a8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_2);
    if ((__range1_2 != (vector<int,_std::allocator<int>_> *)0x0) && ((ulong)__range1_2 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n        ");
    }
    __range1_2 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range1_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    if (*local_3a8 == -1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0,");
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1,
                          (long)*local_3a8);
      std::__cxx11::to_string(&local_3e8,*pvVar4);
      std::operator+(&local_3c8,&local_3e8,",");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_2);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n    };\n\n");
  std::__cxx11::to_string((string *)&__range1_3,n + 1);
  std::operator+(&local_428,"    static constexpr std::array<size_t, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_3);
  std::operator+(&local_408,&local_428,"> val_size {\n        ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&__range1_3);
  __range1_2 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1_3 = std::vector<int,_std::allocator<int>_>::begin(mapping);
  val_3 = (int *)std::vector<int,_std::allocator<int>_>::end(mapping);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &val_3);
    if (!bVar1) break;
    local_468 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_3);
    if ((__range1_2 != (vector<int,_std::allocator<int>_> *)0x0) && ((ulong)__range1_2 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n        ");
    }
    __range1_2 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range1_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    if (*local_468 == -1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0,");
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)*local_468);
      std::__cxx11::to_string(&local_4a8,*pvVar4);
      std::operator+(&local_488,&local_4a8,",");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_3);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n    };\n\n");
  local_81 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((local_81 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string getCommonCodeGen(const std::vector<KeyType>& keys,
                             const std::vector<std::string> vals,
                             const std::vector<int>& mapping,
                             size_t n,
                             std::string map_name,
                             bool nonKeyLookups){
    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);

    std::string str = "//CODEGEN FILE\n"
                      "#ifndef POIFECT_" + upper_name + "_H\n"
                      "#define POIFECT_" + upper_name + "_H\n"
                      "#include <array>\n";

    if(!nonKeyLookups) str += "#include <cassert>\n";

    str += "#include <limits>\n"
           "#include <string>\n\n";

    str += "class " + map_name + " final{\n"
    "public:\n"
    "    static " + (typeStr(keys[0])!="std::string" ? "constexpr " : "")
            + "std::string_view lookup(const " + typeStr(keys[0]) + "& key) noexcept;\n"
    "\n"
    "private:\n";

    if(!nonKeyLookups) str += "    #ifndef NDEBUG\n";
    writeKeys(str, keys, mapping, n);
    if(!nonKeyLookups) str += "    #endif\n";
    str += "\n";

    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& val : vals){
        start.push_back(num_chars);
        num_chars += val.size();
        sze.push_back(val.size());
    }

    str += "    static constexpr char flat_vals[" + std::to_string(num_chars+1) + "] = ";
    for(const std::string& val : vals){
        str.push_back('\n');
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        str += '"' + val + '"';
    }
    str += ";\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    return str;
}